

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O2

resource loader::anon_unknown_0::pe_reader::find_resource
                   (istream *is,uint32_t name,uint32_t type,uint32_t language)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  resource rVar9;
  section *__first;
  ulong uVar15;
  allocator<loader::(anonymous_namespace)::pe_reader::section> *extraout_RDX;
  size_t __n;
  section *psVar16;
  size_type __len;
  ulong uVar17;
  section_table sections;
  resource rVar10;
  resource rVar11;
  resource rVar12;
  resource rVar13;
  resource rVar14;
  
  std::istream::seekg((long)is,_S_end);
  uVar1 = util::load<short,util::little_endian>(is);
  std::istream::seekg((long)is,0xc);
  uVar2 = util::load<short,util::little_endian>(is);
  std::istream::seekg((long)is,_S_end);
  iVar4 = std::istream::tellg();
  uVar3 = util::load<short,util::little_endian>(is);
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
    rVar13.offset = 0;
    rVar13.size = 0;
    return rVar13;
  }
  std::istream::seekg((long)is,(uint)(uVar3 == 0x20b) * 0x10 + 0x5a);
  uVar5 = util::load<int,util::little_endian>(is);
  if (uVar5 < 3) {
    rVar12.offset = 0;
    rVar12.size = 0;
    return rVar12;
  }
  if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
    rVar11.offset = 0;
    rVar11.size = 0;
    return rVar11;
  }
  std::istream::seekg((long)is,0x10);
  uVar5 = util::load<int,util::little_endian>(is);
  uVar6 = util::load<int,util::little_endian>(is);
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
    rVar14.offset = 0;
    rVar14.size = 0;
    return rVar14;
  }
  if (uVar5 == 0) {
    rVar10.offset = 0;
    rVar10.size = 0;
    return rVar10;
  }
  if (uVar6 == 0) {
    rVar9.offset = 0;
    rVar9.size = 0;
    return rVar9;
  }
  sections.sections.
  super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sections.sections.
  super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sections.sections.
  super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::istream::seekg(is,iVar4 + (uint)uVar2,0);
  if (uVar1 == 0) {
    psVar16 = (section *)0x0;
    __first = (section *)0x0;
  }
  else {
    uVar15 = (ulong)uVar1;
    __first = (section *)operator_new(uVar15 * 0xc);
    std::
    __uninitialized_default_n_a<loader::(anonymous_namespace)::pe_reader::section*,unsigned_long,loader::(anonymous_namespace)::pe_reader::section>
              (__first,uVar15,extraout_RDX);
    std::
    _Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
    ::_M_deallocate((_Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
                     *)0x0,(pointer)0x0,__n);
    sections.sections.
    super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first + uVar15;
    sections.sections.
    super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
    ._M_impl.super__Vector_impl_data._M_start = __first;
    sections.sections.
    super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         sections.sections.
         super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    psVar16 = sections.sections.
              super__Vector_base<loader::(anonymous_namespace)::pe_reader::section,_std::allocator<loader::(anonymous_namespace)::pe_reader::section>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; __first != psVar16; __first = __first + 1) {
    std::istream::seekg((long)is,8);
    uVar6 = util::load<int,util::little_endian>(is);
    __first->virtual_size = uVar6;
    uVar6 = util::load<int,util::little_endian>(is);
    __first->virtual_address = uVar6;
    std::istream::seekg((long)is,4);
    uVar6 = util::load<int,util::little_endian>(is);
    __first->raw_address = uVar6;
    std::istream::seekg((long)is,0x10);
  }
  if ((((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) &&
     (uVar7 = section_table::to_file_offset(&sections,uVar5), uVar7 != 0)) {
    std::istream::seekg(is,uVar7,0);
    uVar8 = find_resource_entry(is,type);
    if ((int)uVar8 < 0) {
      std::istream::seekg(is,(uVar8 & 0x7fffffff) + uVar7,0);
      uVar8 = find_resource_entry(is,name);
      if ((int)uVar8 < 0) {
        std::istream::seekg(is,(uVar8 & 0x7fffffff) + uVar7,0);
        uVar8 = find_resource_entry(is,language);
        if (0 < (int)uVar8) {
          std::istream::seekg(is,uVar8 + uVar7,0);
          uVar5 = util::load<int,util::little_endian>(is);
          uVar6 = util::load<int,util::little_endian>(is);
          if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
            uVar7 = section_table::to_file_offset(&sections,uVar5);
            uVar17 = (ulong)uVar7;
            uVar15 = 0;
            if (uVar7 != 0) {
              uVar15 = (ulong)uVar6 << 0x20;
            }
            goto LAB_0012e4fc;
          }
        }
      }
    }
  }
  uVar17 = 0;
  uVar15 = 0;
LAB_0012e4fc:
  section_table::~section_table(&sections);
  return (resource)(uVar17 | uVar15);
}

Assistant:

pe_reader::resource pe_reader::find_resource(std::istream & is, boost::uint32_t name,
                                             boost::uint32_t type,
                                             boost::uint32_t language) {
	
	resource result;
	result.offset = result.size = 0;
	
	header coff;
	if(!coff.load(is)) {
		return result;
	}
	
	section_table sections;
	if(!sections.load(is, coff)) {
		return result;
	}
	
	boost::uint32_t resource_offset = sections.to_file_offset(coff.resource_table_address);
	if(!resource_offset) {
		return result;
	}
	
	is.seekg(resource_offset);
	boost::uint32_t type_offset = find_resource_entry(is, type);
	if(!get_resource_table(type_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(type_offset);
	boost::uint32_t name_offset = find_resource_entry(is, name);
	if(!get_resource_table(name_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(name_offset);
	boost::uint32_t leaf_offset = find_resource_entry(is, language);
	if(!leaf_offset || get_resource_table(leaf_offset, resource_offset)) {
		return result;
	}
	
	// Virtual memory address and size of the resource data.
	is.seekg(leaf_offset);
	boost::uint32_t data_address = util::load<boost::uint32_t>(is);
	boost::uint32_t data_size = util::load<boost::uint32_t>(is);
	// ignore codepage and reserved word
	if(is.fail()) {
		return result;
	}
	
	boost::uint32_t data_offset = sections.to_file_offset(data_address);
	if(!data_offset) {
		return result;
	}
	
	result.offset = data_offset;
	result.size = data_size;
	
	return result;
}